

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::eval<1>(RuleWavelet *this,int point,double x)

{
  double node;
  double x_local;
  int point_local;
  RuleWavelet *this_local;
  
  if (this->order == 1) {
    if (point < 3) {
      getNode(this,point);
      if (point == 0) {
        this_local = (RuleWavelet *)
                     (~-(ulong)(x < 0.0) & 0xbff0000000000000 |
                     (ulong)((uint)(-(ulong)(x < 0.0) >> 0x20) & 0x3ff00000) << 0x20);
      }
      else if (point == 1) {
        this_local = (RuleWavelet *)
                     ((ulong)((uint)(-(ulong)(x < 0.0) >> 0x20) & 0xbff00000) << 0x20);
      }
      else {
        this_local = (RuleWavelet *)(~-(ulong)(x < 0.0) & 0x3ff0000000000000);
      }
    }
    else {
      this_local = (RuleWavelet *)eval_linear<1>(this,point,x);
    }
  }
  else if (this->order == 3) {
    this_local = (RuleWavelet *)eval_cubic<1>(this,point,x);
  }
  else {
    this_local = (RuleWavelet *)0x0;
  }
  return (double)this_local;
}

Assistant:

double RuleWavelet::eval(int point, double x) const{
    // Evaluates or differentiates a wavelet designated by point at coordinate x.
    if(order == 1){
        // Level 0
        if (point < 3){
            double node = getNode(point);
            if (mode == 0) {
                double w = 1.0 - std::abs(x - node);
                return (w < 0.0) ? 0.0 : w;
            }else{
                // Preserve the symmetry of derivatives as much as possible.
                if (point == 0) return (x < 0.0) ? 1.0 : -1.0;
                else if (point == 1) return (x < 0.0) ? -1.0 : 0.0;
                else return (x < 0.0) ? 0.0 : 1.0;
            }
        }
        // Level 1+
        return eval_linear<mode>(point, x);
    }
    else if(order == 3){
        return eval_cubic<mode>(point, x);
    }
    return 0.;
}